

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O2

string * __thiscall
cmFilePathChecksum::get(string *__return_storage_ptr__,cmFilePathChecksum *this,string *filePath)

{
  bool bVar1;
  long lVar2;
  string fileReal;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashBytes;
  string local_a8;
  string relSeed;
  string relPath;
  string local_48;
  
  relPath._M_dataplus._M_p = (pointer)&relPath.field_2;
  relPath._M_string_length = 0;
  relPath.field_2._M_local_buf[0] = '\0';
  relSeed._M_dataplus._M_p = (pointer)&relSeed.field_2;
  relSeed._M_string_length = 0;
  relSeed.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetRealPath(&fileReal,filePath,(string *)0x0);
  hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  lVar2 = 0;
  do {
    if (lVar2 == -0x100) {
LAB_002f0d10:
      if (hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish == (pointer)0x0) {
        std::__cxx11::string::assign((char *)&relSeed);
        cmsys::SystemTools::SplitPathRootComponent(&fileReal,(string *)&hashBytes);
      }
      cmsys::SystemTools::GetParentDirectory(&local_48,&fileReal);
      cmsys::SystemTools::RelativePath(&local_a8,(string *)&hashBytes,&local_48);
      std::__cxx11::string::operator=((string *)&relPath,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&hashBytes);
      std::__cxx11::string::~string((string *)&fileReal);
      cmCryptoHash::cmCryptoHash((cmCryptoHash *)&local_a8,AlgoSHA256);
      std::operator+(&fileReal,&relSeed,&relPath);
      cmCryptoHash::ByteHashString(&hashBytes,(cmCryptoHash *)&local_a8,&fileReal);
      std::__cxx11::string::~string((string *)&fileReal);
      cmCryptoHash::~cmCryptoHash((cmCryptoHash *)&local_a8);
      cmBase32Encoder::cmBase32Encoder((cmBase32Encoder *)&fileReal);
      cmBase32Encoder::encodeString_abi_cxx11_
                (__return_storage_ptr__,(cmBase32Encoder *)&fileReal,
                 hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 (long)hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,false);
      cmBase32Encoder::~cmBase32Encoder((cmBase32Encoder *)&fileReal);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::__cxx11::string::~string((string *)&relSeed);
      std::__cxx11::string::~string((string *)&relPath);
      return __return_storage_ptr__;
    }
    if (((string *)this)->_M_string_length != 0) {
      bVar1 = cmsys::SystemTools::IsSubDirectory(&fileReal,(string *)this);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)&hashBytes);
        std::__cxx11::string::_M_assign((string *)&relSeed);
        goto LAB_002f0d10;
      }
    }
    lVar2 = lVar2 + -0x40;
    this = (cmFilePathChecksum *)((long)this + 0x40);
  } while( true );
}

Assistant:

std::string cmFilePathChecksum::get(std::string const& filePath) const
{
  std::string relPath;
  std::string relSeed;
  {
    std::string const fileReal = cmSystemTools::GetRealPath(filePath);
    std::string parentDir;
    // Find closest project parent directory
    for (auto const& pDir : this->parentDirs) {
      if (!pDir.first.empty() &&
          cmsys::SystemTools::IsSubDirectory(fileReal, pDir.first)) {
        parentDir = pDir.first;
        relSeed = pDir.second;
        break;
      }
    }
    // Use file system root as fallback parent directory
    if (parentDir.empty()) {
      relSeed = "FileSystemRoot";
      cmsys::SystemTools::SplitPathRootComponent(fileReal, &parentDir);
    }
    // Calculate relative path from project parent directory
    relPath = cmsys::SystemTools::RelativePath(
      parentDir, cmsys::SystemTools::GetParentDirectory(fileReal));
  }

  // Calculate the file ( seed + relative path ) binary checksum
  std::vector<unsigned char> hashBytes =
    cmCryptoHash(cmCryptoHash::AlgoSHA256).ByteHashString(relSeed + relPath);

  // Convert binary checksum to string
  return cmBase32Encoder().encodeString(hashBytes.data(), hashBytes.size(),
                                        false);
}